

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_blind_nonce_list,BlindFactor *asset_blind_factor,BlindFactor *entropy)

{
  ByteData256 *__x;
  pointer pAVar1;
  pointer pAVar2;
  Amount *pAVar3;
  Script *pSVar4;
  pointer pCVar5;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  _func_int **pp_Var6;
  int iVar7;
  value_type_conflict1 *__val;
  pointer puVar8;
  size_t sVar9;
  size_t sVar10;
  int64_t iVar11;
  CfdException *pCVar12;
  Amount *amount;
  ulong uVar13;
  size_t sVar14;
  Amount *amount_00;
  Script *this_00;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  pointer in_stack_fffffffffffffe18;
  ConfidentialNonce nonce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  int ret;
  ConfidentialAssetId *local_170;
  ByteData local_168;
  ByteData256 local_150;
  ConfidentialValue local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  ByteData256 local_f8;
  ByteData256 local_e0;
  ByteData256 local_c8;
  ConfidentialValue local_b0;
  ConfidentialValue local_88;
  ByteData local_60;
  ByteData local_48;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x7c8,"SetAssetReissuance");
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&nonce,
             &(this->vin_).
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[tx_in_index].inflation_keys_);
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = (long)nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           CONCAT44(nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_);
  if (uVar13 == 0) {
    puVar8 = (pointer)0x0;
  }
  else {
    if ((long)uVar13 < 0) {
      ::std::__throw_bad_alloc();
    }
    puVar8 = (pointer)operator_new(uVar13);
  }
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar8 + uVar13;
  sVar14 = (long)nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)CONCAT44(nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_);
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar8;
  if (sVar14 != 0) {
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8;
    memmove(puVar8,(void *)CONCAT44(nonce.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    nonce.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_),sVar14);
  }
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar8 + sVar14;
  sVar9 = ByteData::GetDataSize((ByteData *)&asset);
  bVar18 = true;
  if (sVar9 == 0) {
    ConfidentialValue::ConfidentialValue
              (&local_138,
               &(this->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].issuance_amount_);
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar13 = (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar13 == 0) {
      puVar8 = (pointer)0x0;
    }
    else {
      if ((long)uVar13 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar8 = (pointer)operator_new(uVar13);
    }
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar8 + uVar13;
    sVar14 = (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar8;
    if (sVar14 != 0) {
      local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
      memmove(puVar8,local_138.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar14);
    }
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8 + sVar14;
    sVar10 = ByteData::GetDataSize(&local_168);
    bVar18 = sVar10 != 0;
  }
  if (sVar9 == 0) {
    if (local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_138._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025b008;
    if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialValue_0025b008;
  if ((void *)CONCAT44(nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (bVar18) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x221227;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7cc;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"already set to reissue parameter"
                 );
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"already set to reissue parameter","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar11 = Amount::GetSatoshiValue(asset_amount);
  if (iVar11 < 1) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x221227;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7d2;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                  "ReIssuance must have one non-zero amount.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"ReIssuance must have one non-zero amount.","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pAVar1 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pAVar1 == pAVar2) ==
      ((asset_locking_script_list->
       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
       super__Vector_impl_data._M_start ==
      (asset_locking_script_list->
      super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (pAVar1 != pAVar2) {
      Amount::Amount((Amount *)&asset);
      amount_00 = (asset_output_amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start;
      pAVar3 = (asset_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (amount_00 != pAVar3) {
        do {
          Amount::operator+=((Amount *)&asset,amount_00);
          amount_00 = amount_00 + 1;
        } while (amount_00 != pAVar3);
      }
      bVar18 = Amount::operator!=((Amount *)&asset,asset_amount);
      if (bVar18) {
        nonce._vptr_ConfidentialNonce = (_func_int **)0x221227;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x7e4;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetReissuance";
        logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"Unmatch asset amount.");
        pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
        nonce._vptr_ConfidentialNonce =
             (_func_int **)
             &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&nonce,"Unmatch asset amount.","");
        CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&nonce);
        __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pSVar4 = (asset_locking_script_list->
               super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_00 = (asset_locking_script_list->
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                     _M_impl.super__Vector_impl_data._M_start; this_00 != pSVar4;
          this_00 = this_00 + 1) {
        bVar18 = Script::IsEmpty(this_00);
        if (bVar18) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x221227;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7e9;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetReissuance";
          logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                        "Empty locking script from asset.");
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          nonce._vptr_ConfidentialNonce =
               (_func_int **)
               &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&nonce,"Empty locking script from asset.","");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
    }
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x20;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    __x = &entropy->data_;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150,&__x->data_);
    ByteData256::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce,&local_150);
    pp_Var6 = nonce._vptr_ConfidentialNonce;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,&__x->data_);
    ByteData256::GetBytes(&local_110,&local_c8);
    iVar7 = wally_tx_elements_issuance_calculate_asset
                      (pp_Var6,(long)local_110.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_110.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                       asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (nonce._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(nonce._vptr_ConfidentialNonce);
    }
    if (local_150.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ret = iVar7;
    if (iVar7 == 0) {
      BlindFactor::BlindFactor(&__return_storage_ptr__->entropy);
      local_170 = &__return_storage_ptr__->asset;
      ConfidentialAssetId::ConfidentialAssetId(local_170);
      ConfidentialAssetId::ConfidentialAssetId(&__return_storage_ptr__->token);
      if (__return_storage_ptr__ != (IssuanceParameter *)entropy) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &(__return_storage_ptr__->entropy).data_,&__x->data_);
      }
      ByteData::ByteData((ByteData *)&local_150,&asset);
      ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&nonce,(ByteData *)&local_150)
      ;
      if (local_170 != (ConfidentialAssetId *)&nonce) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &(__return_storage_ptr__->asset).data_,&nonce.data_.data_);
        (__return_storage_ptr__->asset).version_ = nonce.version_;
      }
      nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialAssetId_0025afe8;
      if ((void *)CONCAT44(nonce.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           nonce.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(nonce.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         nonce.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if (local_150.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
                 &(asset_blind_factor->data_).data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,&__x->data_);
      ConfidentialValue::ConfidentialValue(&local_88,asset_amount);
      ConfidentialValue::ConfidentialValue(&local_b0);
      ByteData::ByteData(&local_48);
      ByteData::ByteData(&local_60);
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_60;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_48;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe18;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start._0_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)nonce._vptr_ConfidentialNonce;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start._4_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      SetIssuance(this,tx_in_index,&local_e0,&local_f8,&local_88,&local_b0,
                  issuance_amount_rangeproof,inflation_keys_rangeproof);
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_b0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025b008;
      if (local_b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_88._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025b008;
      if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar11 = Amount::GetSatoshiValue(asset_amount);
        if ((0 < iVar11) &&
           ((asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_finish !=
            (asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_start)) {
          lVar16 = 0;
          lVar17 = 0;
          lVar15 = 0;
          uVar13 = 0;
          do {
            ConfidentialNonce::ConfidentialNonce(&nonce);
            pCVar5 = (asset_blind_nonce_list->
                     super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((uVar13 < (ulong)(((long)(asset_blind_nonce_list->
                                         super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5
                                  >> 3) * -0x3333333333333333)) &&
               ((ConfidentialNonce *)((long)&pCVar5->_vptr_ConfidentialNonce + lVar15) != &nonce)) {
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce.data_,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(pCVar5->data_).data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar15));
              nonce.version_ = (&pCVar5->version_)[lVar15];
            }
            AddTxOut(this,(Amount *)
                          ((long)&((asset_output_amount_list->
                                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar17),
                     local_170,
                     (Script *)
                     ((long)&((asset_locking_script_list->
                              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar16),
                     &nonce);
            nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0025afc8;
            if ((void *)CONCAT44(nonce.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 nonce.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
              operator_delete((void *)CONCAT44(nonce.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               nonce.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_));
            }
            uVar13 = uVar13 + 1;
            lVar15 = lVar15 + 0x28;
            lVar17 = lVar17 + 0x10;
            lVar16 = lVar16 + 0x38;
          } while (uVar13 < (ulong)((long)(asset_output_amount_list->
                                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(asset_output_amount_list->
                                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      if (asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    nonce._vptr_ConfidentialNonce = (_func_int **)0x221227;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7f6;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<int&>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                      "wally_tx_elements_issuance_calculate_asset NG[{}].",&ret);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&nonce,"asset calculate error.","");
    CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)&nonce);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)0x221227;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x7d8;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetAssetReissuance";
  logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                "Unmatch count. asset amount list and locking script list.");
  pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
  nonce._vptr_ConfidentialNonce =
       (_func_int **)
       &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,"Unmatch count. asset amount list and locking script list.","");
  CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&nonce);
  __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetReissuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_blind_nonce_list,
    const BlindFactor &asset_blind_factor, const BlindFactor &entropy) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to reissue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to reissue parameter");
  }

  if (asset_amount.GetSatoshiValue() <= 0) {
    warn(CFD_LOG_SOURCE, "ReIssuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "ReIssuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }

  std::vector<uint8_t> asset(kAssetSize);
  int ret = wally_tx_elements_issuance_calculate_asset(
      entropy.GetData().GetBytes().data(), entropy.GetData().GetBytes().size(),
      asset.data(), asset.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_calculate_asset NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "asset calculate error.");
  }

  IssuanceParameter param;
  param.entropy = entropy;
  param.asset = ConfidentialAssetId(ByteData(asset));
  SetIssuance(
      tx_in_index, asset_blind_factor.GetData(), entropy.GetData(),
      ConfidentialValue(asset_amount), ConfidentialValue(), ByteData(),
      ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_blind_nonce_list.size()) {
        nonce = asset_blind_nonce_list[index];
      }
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  return param;
}